

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * read_file_u8(string *file_name)

{
  FILE *__stream;
  long __off;
  FILE *f_00;
  size_t __n;
  uchar *__ptr;
  size_t sVar1;
  string *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  size_t file_size;
  long end;
  long cur;
  FILE *f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *content;
  char *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  string local_40 [32];
  FILE *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1831e6);
  std::__cxx11::string::string(local_40,in_RSI);
  __stream = (FILE *)fopen_or_fail(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_40);
  local_20 = __stream;
  __off = ftell(__stream);
  fseek(local_20,0,2);
  f_00 = (FILE *)ftell(local_20);
  __n = (long)f_00 - __off;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(size_type)in_RDI);
  fseek(local_20,__off,0);
  __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1832bd);
  sVar1 = fread(__ptr,1,__n,local_20);
  if (sVar1 != __n) {
    quit("reading file content failed: %d",sVar1);
  }
  fclose_or_fail(f_00);
  return this;
}

Assistant:

std::vector<uint8_t> read_file_u8(std::string file_name)
{
    std::vector<uint8_t> content;
    auto f = fopen_or_fail(file_name, "rb");
    auto cur = ftell(f);
    fseek(f, 0, SEEK_END);
    auto end = ftell(f);
    size_t file_size = (end - cur);
    content.resize(file_size);
    fseek(f, cur, SEEK_SET);
    size_t ret = fread(content.data(), sizeof(uint8_t), file_size, f);
    if (ret != file_size) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
    return content;
}